

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snapshot.cpp
# Opt level: O2

void __thiscall OpenMD::Snapshot::setBoundingBox(Snapshot *this,Mat3x3d *m)

{
  Mat3x3d *this_00;
  RectMatrix<double,_3U,_3U> local_60;
  
  this_00 = &(this->frameData).bBox;
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)this_00,(RectMatrix<double,_3U,_3U> *)m);
  SquareMatrix3<double>::inverse((SquareMatrix3<double> *)&local_60,this_00);
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)&(this->frameData).invBbox,&local_60);
  this->hasBoundingBox = true;
  return;
}

Assistant:

void Snapshot::setBoundingBox(const Mat3x3d& m) {
    frameData.bBox    = m;
    frameData.invBbox = frameData.bBox.inverse();
    hasBoundingBox    = true;
  }